

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<10>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < *(int *)((long)field + 8); lVar2 = lVar2 + 1) {
    io::CodedOutputStream::WriteVarint32(output,md->tag);
    lVar1 = *(long *)((long)field + 0x10) + 8;
    if (*(long *)((long)field + 0x10) == 0) {
      lVar1 = 0;
    }
    SerializeGroupTo<google::protobuf::io::CodedOutputStream>
              (*(MessageLite **)(lVar1 + lVar2 * 8),md->ptr,output);
    io::CodedOutputStream::WriteVarint32(output,md->tag + 1);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeGroupTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          static_cast<const SerializationTable*>(md.ptr), output);
      WriteTagTo(md.tag + 1, output);
    }
  }